

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

_Bool Curl_conn_is_ip_connected(Curl_easy *data,int sockindex)

{
  Curl_cfilter *local_28;
  Curl_cfilter *cf;
  int sockindex_local;
  Curl_easy *data_local;
  
  local_28 = data->conn->cfilter[sockindex];
  while( true ) {
    if (local_28 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((local_28->field_0x24 & 1) != 0) break;
    if ((local_28->cft->flags & 1U) != 0) {
      return false;
    }
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool Curl_conn_is_ip_connected(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->connected)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
    cf = cf->next;
  }
  return FALSE;
}